

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O1

Ref<anurbs::BrepEdge> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepEdge>::replace
          (PythonDataType<anurbs::Model,_anurbs::BrepEdge> *this,Model *self,size_t index,
          Pointer<anurbs::BrepEdge> *data)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Ref<anurbs::BrepEdge> RVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_00 = (data->super___shared_ptr<anurbs::BrepEdge,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  RVar2 = Model::replace<anurbs::BrepEdge>
                    ((Model *)this,(size_t)self,(Pointer<anurbs::BrepEdge> *)index);
  _Var1._M_pi = RVar2.m_entry.
                super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var1._M_pi = extraout_RDX;
  }
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepEdge>)
         RVar2.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> replace(TModel& self, const size_t index,
        Pointer<TData> data)
    {
        return self.template replace<TData>(index, data);
    }